

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersErrorsTest::iterate
          (VertexBuffersErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  undefined4 extraout_var;
  char *description;
  byte bVar10;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint bo;
  GLuint vao;
  GLsizei valid_stride;
  GLintptr valid_offset;
  GLint max_vertex_attrib_bindings;
  GLuint not_a_bo;
  GLint max_vertex_attrib_stride;
  GLsizei invalid_stride_1;
  GLsizei invalid_stride_0;
  GLintptr invalid_offset;
  int local_6c;
  int local_68;
  undefined4 local_64;
  byte local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  undefined8 local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40 [2];
  undefined8 local_38;
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    local_68 = 0;
    local_6c = 0;
    local_48 = 0;
    local_58 = 0;
    local_64 = 1;
    local_4c = 0x10;
    local_44 = 0x800;
    (**(code **)(lVar9 + 0x410))(1);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x11c4);
    (**(code **)(lVar9 + 0x3b8))(1,&local_6c);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glCreateBuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x11c7);
    iVar7 = 0;
    do {
      iVar7 = iVar7 + 1;
      cVar3 = (**(code **)(lVar9 + 0xcd8))(iVar7);
    } while (cVar3 != '\0');
    do {
      local_48 = local_48 + 1;
      cVar3 = (**(code **)(lVar9 + 0xc68))();
    } while (cVar3 != '\0');
    (**(code **)(lVar9 + 0x868))(0x82da,&local_4c);
    (**(code **)(lVar9 + 0x868))(0x82e5,&local_44);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x11d2);
    local_38 = 0xffffffffffffffff;
    local_40[1] = 0xffffffff;
    local_40[0] = local_44 + 1;
    (**(code **)(lVar9 + 0x1760))(iVar7,0,local_6c,local_58,local_64);
    bVar1 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if vaobj is not the name of an existing vertex array object."
                      );
    (**(code **)(lVar9 + 0x1768))(iVar7,0,1,&local_6c,&local_58,&local_64);
    local_59 = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if vaobj is not the name of an existing vertex array object."
                         );
    (**(code **)(lVar9 + 0x1760))(local_68,0,local_48,local_58,local_64);
    local_5a = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if vaobj is not the name of an existing vertex array object."
                         );
    (**(code **)(lVar9 + 0x1768))(local_68,0,1,&local_48,&local_58,&local_64);
    local_5b = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if vaobj is not the name of an existing vertex array object."
                         );
    (**(code **)(lVar9 + 0x1760))(local_68,local_4c,local_6c,local_58,local_64);
    local_5c = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayVertexBuffer if bindingindex is equal to the value of MAX_VERTEX_ATTRIB_BINDINGS."
                         );
    (**(code **)(lVar9 + 0x1760))(local_68,local_4c + 1,local_6c,local_58,local_64);
    local_5d = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayVertexBuffer if bindingindex is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS."
                         );
    (**(code **)(lVar9 + 0x1768))(local_68,local_4c,1,&local_6c,&local_58,&local_64);
    local_5e = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if first+count is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS."
                         );
    (**(code **)(lVar9 + 0x1760))(local_68,0,local_6c,0xffffffffffffffff,local_64);
    local_5f = CheckError(this,0x501,
                          "INVALID_VALUE is generated by VertexArrayVertexBuffer if offset less than zero."
                         );
    (**(code **)(lVar9 + 0x1760))(local_68,0,local_6c,local_58,0xffffffff);
    local_60 = CheckError(this,0x501,
                          "INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is less than zero."
                         );
    (**(code **)(lVar9 + 0x1760))(local_68,0,local_6c,local_58,local_44 + 1);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is greater than the value of MAX_VERTEX_ATTRIB_STRIDE."
                      );
    (**(code **)(lVar9 + 0x1768))(local_68,0,1,&local_6c,&local_38,&local_64);
    bVar4 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in offsets is negative."
                      );
    (**(code **)(lVar9 + 0x1768))(local_68,0,1,&local_6c,&local_58,local_40 + 1);
    bVar5 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in strides is negative."
                      );
    (**(code **)(lVar9 + 0x1768))(local_68,0,1,&local_6c,&local_58,local_40);
    bVar6 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffers if a value in strides is greater than the value of MAX_VERTEX_ATTRIB_STRIDE."
                      );
    bVar10 = bVar1 & local_59 & local_5a & local_5b & local_5c & local_5d & local_5e & local_5f &
             local_60;
    if (local_68 != 0) {
      (**(code **)(lVar9 + 0x490))(1);
    }
    if (local_6c != 0) {
      (**(code **)(lVar9 + 0x438))(1);
    }
    do {
      iVar7 = (**(code **)(lVar9 + 0x800))();
    } while (iVar7 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar10 & bVar2 & bVar4 & bVar5 & bVar6) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult VertexBuffersErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;
	glw::GLuint bo		  = 0;
	glw::GLuint not_a_bo  = 0;

	/* Valid setup. */
	glw::GLintptr valid_offset = 0;
	glw::GLsizei  valid_stride = 1;

	/* Limits. (Minimum values - OpenGL 4.5 Core Specification, Table 23.55) */
	glw::GLint max_vertex_attrib_bindings = 16;
	glw::GLint max_vertex_attrib_stride   = 2048;

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		gl.createBuffers(1, &bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;
		while (gl.isBuffer(++not_a_bo))
			;

		/* Prepare limits. */
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_vertex_attrib_bindings);
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &max_vertex_attrib_stride);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		/* Invalid setup. */
		glw::GLintptr invalid_offset   = -1;
		glw::GLsizei  invalid_stride_0 = -1;
		glw::GLsizei  invalid_stride_1 = max_vertex_attrib_stride + 1;

		/* Test not a VAO. */
		gl.vertexArrayVertexBuffer(not_a_vao, 0, bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayVertexBuffers(not_a_vao, 0, 1, &bo, &valid_offset, &valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if "
												  "vaobj is not the name of an existing vertex array object.");

		/* Test not a BO. */
		gl.vertexArrayVertexBuffer(vao, 0, not_a_bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &not_a_bo, &valid_offset, &valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if "
												  "vaobj is not the name of an existing vertex array object.");

		/* Test too big binding index. */
		gl.vertexArrayVertexBuffer(vao, max_vertex_attrib_bindings, bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayVertexBuffer if "
											  "bindingindex is equal to the value of MAX_VERTEX_ATTRIB_BINDINGS.");

		gl.vertexArrayVertexBuffer(vao, max_vertex_attrib_bindings + 1, bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayVertexBuffer if "
											  "bindingindex is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS.");

		gl.vertexArrayVertexBuffers(vao, max_vertex_attrib_bindings, 1, &bo, &valid_offset, &valid_stride);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if "
											 "first+count is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS.");

		/* Test too big stride. */
		gl.vertexArrayVertexBuffer(vao, 0, bo, -1, valid_stride);

		is_ok &= CheckError(GL_INVALID_VALUE,
							"INVALID_VALUE is generated by VertexArrayVertexBuffer if offset less than zero.");

		gl.vertexArrayVertexBuffer(vao, 0, bo, valid_offset, -1);

		is_ok &= CheckError(GL_INVALID_VALUE,
							"INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is less than zero.");

		gl.vertexArrayVertexBuffer(vao, 0, bo, valid_offset, max_vertex_attrib_stride + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is "
											  "greater than the value of MAX_VERTEX_ATTRIB_STRIDE.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &bo, &invalid_offset, &valid_stride);

		is_ok &=
			CheckError(GL_INVALID_VALUE,
					   "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in offsets is negative.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &bo, &valid_offset, &invalid_stride_0);

		is_ok &=
			CheckError(GL_INVALID_VALUE,
					   "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in strides is negative.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &bo, &valid_offset, &invalid_stride_1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE is generated by VertexArrayVertexBuffers if a value in "
											  "strides is greater than the value of MAX_VERTEX_ATTRIB_STRIDE.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	if (bo)
	{
		gl.deleteBuffers(1, &bo);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}